

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O0

optimistic_lock *
unodb::optimistic_lock::write_guard::try_lock_upgrade(read_critical_section *critical_section)

{
  bool bVar1;
  optimistic_lock *local_30;
  optimistic_lock *result;
  bool upgrade_success;
  read_critical_section *critical_section_local;
  
  bVar1 = try_upgrade_to_write_lock
                    (critical_section->lock,(version_type)(critical_section->version).version);
  if (bVar1) {
    local_30 = critical_section->lock;
  }
  else {
    local_30 = (optimistic_lock *)0x0;
  }
  critical_section->lock = (optimistic_lock *)0x0;
  return local_30;
}

Assistant:

[[nodiscard]] static optimistic_lock *try_lock_upgrade(
        read_critical_section &&critical_section) noexcept {
      const auto upgrade_success =
          critical_section.lock->try_upgrade_to_write_lock(
              critical_section.version);
      auto *const result = UNODB_DETAIL_LIKELY(upgrade_success)
                               ? critical_section.lock
                               : nullptr;
#ifndef NDEBUG
      critical_section.lock = nullptr;
#endif
      return result;
    }